

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPluginAPI.cxx
# Opt level: O0

void cmAddCustomCommandToTarget
               (void *arg,char *target,char *command,int numArgs,char **args,int commandType)

{
  char *workingDir;
  char *comment;
  string *psVar1;
  allocator<char> local_139;
  string local_138;
  allocator<char> local_111;
  string local_110;
  char *local_f0;
  char *no_working_dir;
  char *no_comment;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  no_depends;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  no_byproducts;
  undefined1 local_a8 [4];
  CustomCommandType cctype;
  cmCustomCommandLines commandLines;
  int i;
  allocator<char> local_79;
  undefined1 local_78 [8];
  string expand;
  cmCustomCommandLine commandLine;
  cmMakefile *mf;
  int commandType_local;
  char **args_local;
  int numArgs_local;
  char *command_local;
  char *target_local;
  void *arg_local;
  
  cmCustomCommandLine::cmCustomCommandLine((cmCustomCommandLine *)((long)&expand.field_2 + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_78,command,&local_79);
  std::allocator<char>::~allocator(&local_79);
  psVar1 = cmMakefile::ExpandVariablesInString((cmMakefile *)arg,(string *)local_78);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&expand.field_2 + 8),psVar1);
  for (commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
       super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
      (int)commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
           super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage < numArgs;
      commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
      super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ =
           (int)commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
                .super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage + 1) {
    std::__cxx11::string::operator=
              ((string *)local_78,
               args[(int)commandLines.
                         super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                         super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage]);
    psVar1 = cmMakefile::ExpandVariablesInString((cmMakefile *)arg,(string *)local_78);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&expand.field_2 + 8),psVar1);
  }
  cmCustomCommandLines::cmCustomCommandLines((cmCustomCommandLines *)local_a8);
  std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::push_back
            ((vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> *)local_a8,
             (value_type *)((long)&expand.field_2 + 8));
  no_byproducts.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = POST_BUILD;
  if (commandType == 0) {
    no_byproducts.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = PRE_BUILD;
  }
  else if (commandType == 1) {
    no_byproducts.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = PRE_LINK;
  }
  else if (commandType == 2) {
    no_byproducts.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = POST_BUILD;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&no_depends.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&no_comment);
  no_working_dir = (char *)0x0;
  local_f0 = (char *)0x0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_110,target,&local_111);
  comment = no_working_dir;
  workingDir = local_f0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_138,"",&local_139);
  cmMakefile::AddCustomCommandToTarget
            ((cmMakefile *)arg,&local_110,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&no_depends.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&no_comment,(cmCustomCommandLines *)local_a8,
             no_byproducts.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,comment,workingDir,true,false,
             &local_138,false,RejectObjectLibraryCommands);
  std::__cxx11::string::~string((string *)&local_138);
  std::allocator<char>::~allocator(&local_139);
  std::__cxx11::string::~string((string *)&local_110);
  std::allocator<char>::~allocator(&local_111);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&no_comment);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&no_depends.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cmCustomCommandLines::~cmCustomCommandLines((cmCustomCommandLines *)local_a8);
  std::__cxx11::string::~string((string *)local_78);
  cmCustomCommandLine::~cmCustomCommandLine((cmCustomCommandLine *)((long)&expand.field_2 + 8));
  return;
}

Assistant:

void CCONV cmAddCustomCommandToTarget(void* arg, const char* target,
                                      const char* command, int numArgs,
                                      const char** args, int commandType)
{
  // Get the makefile instance.
  cmMakefile* mf = static_cast<cmMakefile*>(arg);

  // Construct the command line for the command.  Perform an extra
  // variable expansion now because the API caller expects it.
  cmCustomCommandLine commandLine;
  std::string expand = command;
  commandLine.push_back(mf->ExpandVariablesInString(expand));
  for (int i = 0; i < numArgs; ++i) {
    expand = args[i];
    commandLine.push_back(mf->ExpandVariablesInString(expand));
  }
  cmCustomCommandLines commandLines;
  commandLines.push_back(commandLine);

  // Select the command type.
  cmTarget::CustomCommandType cctype = cmTarget::POST_BUILD;
  switch (commandType) {
    case CM_PRE_BUILD:
      cctype = cmTarget::PRE_BUILD;
      break;
    case CM_PRE_LINK:
      cctype = cmTarget::PRE_LINK;
      break;
    case CM_POST_BUILD:
      cctype = cmTarget::POST_BUILD;
      break;
  }

  // Pass the call to the makefile instance.
  std::vector<std::string> no_byproducts;
  std::vector<std::string> no_depends;
  const char* no_comment = nullptr;
  const char* no_working_dir = nullptr;
  mf->AddCustomCommandToTarget(target, no_byproducts, no_depends, commandLines,
                               cctype, no_comment, no_working_dir);
}